

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferOperations::iterateSecondPhase(TextureBufferOperations *this,GLint *result)

{
  int iVar1;
  deUint32 dVar2;
  GLint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar6;
  GLint sampler_location;
  Functions *gl;
  GLint *result_local;
  TextureBufferOperations *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1a8);
  (**(code **)(lVar5 + 0x78))(0x8ca9,this->m_fbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error binding framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1ab);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_to_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1ae);
  (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_to_id,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture to framebuffer\'s color attachment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1b2);
  checkFramebufferStatus(this,0x8ca9);
  (**(code **)(lVar5 + 0x1a00))(0,0,this->m_n_vectors_in_buffer_texture,1);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error setting viewport!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1b9);
  (**(code **)(lVar5 + 0x1680))(this->m_po_vs_fs_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error using program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1bd);
  iVar1 = (**(code **)(lVar5 + 0xb48))(this->m_po_vs_fs_id,"sampler_buffer");
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1c0);
  if (iVar1 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Could not get uniform location",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
               ,0x1c3);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x14f0))(iVar1,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error binding sampler with texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1c7);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_vbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1cb);
  GVar3 = (**(code **)(lVar5 + 0x780))(this->m_po_vs_fs_id,"vs_position");
  this->m_vertex_location = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1ce);
  if (this->m_vertex_location == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Could not get uniform location",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
               ,0x1d1);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x19f0))(this->m_vertex_location,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1d5);
  (**(code **)(lVar5 + 0x610))(this->m_vertex_location);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1d8);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_vbo_indicies_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1dc);
  GVar3 = (**(code **)(lVar5 + 0x780))(this->m_po_vs_fs_id,"vs_index");
  this->m_index_location = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1df);
  if (this->m_index_location == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Could not get uniform location",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
               ,0x1e2);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar5 + 0x19f0))(this->m_index_location,1,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1e6);
  (**(code **)(lVar5 + 0x610))(this->m_index_location);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1e9);
  (**(code **)(lVar5 + 0x1c0))(0,0,0);
  (**(code **)(lVar5 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error clearing color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1ee);
  (**(code **)(lVar5 + 0x538))(5,0,4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1f2);
  (**(code **)(lVar5 + 0x78))(0x8ca8,this->m_fbo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error binding framebuffer object !",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1f6);
  (**(code **)(lVar5 + 0x1220))(0,0,this->m_n_vectors_in_buffer_texture,1,0x8d99,0x1404,result);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error reading pixels !",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x1f9);
  (**(code **)(lVar5 + 0xd8))(0);
  (**(code **)(lVar5 + 0xb8))(0xde1,0);
  (**(code **)(lVar5 + 0x78))(0x8ca9,0);
  (**(code **)(lVar5 + 0x78))(0x8ca8,0);
  (**(code **)(lVar5 + 0x40))(0x8892,0);
  (**(code **)(lVar5 + 0x518))(this->m_vertex_location);
  (**(code **)(lVar5 + 0x518))(this->m_index_location);
  (**(code **)(lVar5 + 0x1680))(0);
  this->m_vertex_location = -1;
  this->m_index_location = -1;
  return;
}

Assistant:

void TextureBufferOperations::iterateSecondPhase(glw::GLint* result)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object!");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* Attach output texture to framebuffer */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to framebuffer's color attachment");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	/* Configure view port */
	gl.viewport(0, 0, m_n_vectors_in_buffer_texture, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting viewport!");

	/* Use program */
	gl.useProgram(m_po_vs_fs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program object!");

	glw::GLint sampler_location = gl.getUniformLocation(m_po_vs_fs_id, "sampler_buffer");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");
	if (sampler_location == -1)
	{
		TCU_FAIL("Could not get uniform location");
	}

	gl.uniform1i(sampler_location, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding sampler with texture unit!");

	/* Configure vertex position attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_vertex_location = gl.getAttribLocation(m_po_vs_fs_id, "vs_position");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");
	if (m_vertex_location == -1)
	{
		TCU_FAIL("Could not get uniform location");
	}

	gl.vertexAttribPointer(m_vertex_location, 4, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_vertex_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Configure index attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_indicies_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_index_location = gl.getAttribLocation(m_po_vs_fs_id, "vs_index");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");
	if (m_index_location == -1)
	{
		TCU_FAIL("Could not get uniform location");
	}

	gl.vertexAttribPointer(m_index_location, 1, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_index_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Clear texture */
	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error clearing color buffer");

	/* Render */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	/* Read result data */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object !");

	gl.readPixels(0, 0, m_n_vectors_in_buffer_texture, 1, GL_RGBA_INTEGER, GL_INT, result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels !");

	gl.bindVertexArray(0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.disableVertexAttribArray(m_vertex_location);
	gl.disableVertexAttribArray(m_index_location);
	gl.useProgram(0);

	m_vertex_location = -1;
	m_index_location  = -1;
}